

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int __thiscall fmt::v7::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  ulong uVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  if (this == divisor) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x2e7,"");
  }
  iVar4 = compare(this,divisor);
  if (iVar4 < 0) {
    iVar4 = 0;
  }
  else {
    if ((divisor->bigits_).super_buffer<unsigned_int>.ptr_
        [(divisor->bigits_).super_buffer<unsigned_int>.size_ - 1] == 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0x2ea,"");
    }
    uVar9 = this->exp_ - divisor->exp_;
    if (uVar9 != 0 && divisor->exp_ <= this->exp_) {
      iVar4 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
      if ((int)(uVar9 + iVar4) < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                    ,0x13c,"negative value");
      }
      uVar10 = (ulong)(uVar9 + iVar4);
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar10) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
      }
      uVar1 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
      if (uVar1 < uVar10) {
        uVar10 = uVar1;
      }
      (this->bigits_).super_buffer<unsigned_int>.size_ = uVar10;
      if (0 < iVar4) {
        puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        lVar8 = (long)(int)(uVar9 + iVar4 + -1);
        lVar6 = (ulong)(iVar4 - 1) + 1;
        do {
          puVar2[lVar8] = puVar2[lVar6 + -1];
          lVar8 = lVar8 + -1;
          lVar7 = lVar6 + -1;
          bVar3 = 0 < lVar6;
          lVar6 = lVar7;
        } while (lVar7 != 0 && bVar3);
      }
      memset((this->bigits_).super_buffer<unsigned_int>.ptr_,0,(ulong)uVar9 << 2);
      this->exp_ = this->exp_ - uVar9;
    }
    iVar4 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar4 = iVar4 + 1;
      iVar5 = compare(this,divisor);
    } while (-1 < iVar5);
  }
  return iVar4;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }